

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall Tokenizer::nextPos(Tokenizer *this)

{
  ulong uVar1;
  pointer pbVar2;
  unsigned_long uVar3;
  string *psVar4;
  unsigned_long uVar5;
  bool bVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  uVar1 = (this->_ptr).first;
  pbVar2 = (this->_lines_buffer).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)(this->_lines_buffer).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    uVar3 = (this->_ptr).second;
    bVar6 = uVar3 == pbVar2[uVar1]._M_string_length - 1;
    uVar5 = 0;
    if (!bVar6) {
      uVar5 = uVar3 + 1;
    }
    pVar7.first = bVar6 + uVar1;
    pVar7.second = uVar5;
    return pVar7;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"advance after EOF","");
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_40,local_40 + local_38);
  *(undefined8 *)(psVar4 + 0x20) = 0;
  __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

std::pair<uint64_t, uint64_t> Tokenizer::nextPos() {
	if (_ptr.first >= _lines_buffer.size())
		throw Error("advance after EOF");
	if (_ptr.second == _lines_buffer[_ptr.first].size() - 1)
		return std::make_pair(_ptr.first + 1, 0);
	else
		return std::make_pair(_ptr.first, _ptr.second + 1);
}